

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

void __thiscall Assimp::DefaultLogger::~DefaultLogger(DefaultLogger *this)

{
  LogStreamInfo *pLVar1;
  pointer ppLVar2;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__DefaultLogger_00244758;
  for (ppLVar2 = (this->m_StreamArray).
                 super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar2 !=
      (this->m_StreamArray).
      super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppLVar2 = ppLVar2 + 1) {
    pLVar1 = *ppLVar2;
    if ((pLVar1 != (LogStreamInfo *)0x0) && (pLVar1->m_pStream != (LogStream *)0x0)) {
      (*pLVar1->m_pStream->_vptr_LogStream[1])();
    }
    operator_delete(pLVar1);
  }
  std::_Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::
  ~_Vector_base(&(this->m_StreamArray).
                 super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
               );
  return;
}

Assistant:

DefaultLogger::~DefaultLogger() {
    for ( StreamIt it = m_StreamArray.begin(); it != m_StreamArray.end(); ++it ) {
        // also frees the underlying stream, we are its owner.
        delete *it;
    }
}